

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperOpFailure<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
          (internal *this,char *expr1,char *expr2,iterator_base<true> *val1,
          iterator_base<true> *val2,char *op)

{
  AssertionResult *pAVar1;
  iterator_base<true> *value;
  iterator_base<true> *value_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  AssertionResult AVar2;
  char *local_88;
  char *local_80;
  char *local_78;
  AssertionResult local_70;
  string local_60;
  string local_40;
  
  local_88 = op;
  local_80 = expr2;
  local_78 = expr1;
  AssertionFailure();
  pAVar1 = AssertionResult::operator<<(&local_70,(char (*) [12])"Expected: (");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_78);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])") ");
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_88);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [3])0x1c88dd);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_80);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [12])"), actual: ");
  PrintToString<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
            (&local_40,(testing *)val1,value);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_40);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" vs ");
  PrintToString<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>::iterator_base<true>>
            (&local_60,(testing *)val2,value_00);
  pAVar1 = AssertionResult::operator<<(pAVar1,&local_60);
  AssertionResult::AssertionResult((AssertionResult *)this,pAVar1);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&local_70.message_);
  AVar2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
       ._M_head_impl;
  AVar2._0_8_ = this;
  return AVar2;
}

Assistant:

AssertionResult CmpHelperOpFailure(const char* expr1, const char* expr2,
                                   const T1& val1, const T2& val2,
                                   const char* op) {
  return AssertionFailure()
         << "Expected: (" << expr1 << ") " << op << " (" << expr2
         << "), actual: " << FormatForComparisonFailureMessage(val1, val2)
         << " vs " << FormatForComparisonFailureMessage(val2, val1);
}